

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerseusStationary.cpp
# Opt level: O2

void __thiscall PerseusStationary::SetBeliefSet(PerseusStationary *this,BeliefSet *S)

{
  _Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *this_00;
  vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *this_01;
  
  if ((this->super_Perseus)._m_beliefsInitialized == true) {
    this_00 = *(_Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> **)
               &(this->super_Perseus).field_0xc0;
    if (this_00 !=
        (_Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *)0x0) {
      std::_Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::
      ~_Vector_base(this_00);
    }
    operator_delete(this_00,0x18);
  }
  this_01 = (vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *)
            operator_new(0x18);
  std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::vector(this_01,S);
  *(vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> **)
   &(this->super_Perseus).field_0xc0 = this_01;
  (this->super_Perseus)._m_beliefsInitialized = true;
  return;
}

Assistant:

void PerseusStationary::SetBeliefSet(const BeliefSet &S)
{
    if(_m_beliefsInitialized)
        delete(_m_beliefs);
    _m_beliefs=new BeliefSet(S);
    _m_beliefsInitialized=true;
}